

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpca_stmt_list_apply_to(mpc_val_t *x,void *s)

{
  char *__ptr;
  mpc_parser_t *p;
  mpc_parser_t *pmVar1;
  mpc_parser_t *left;
  mpca_stmt_t **stmts;
  mpca_stmt_t *stmt;
  mpca_grammar_st_t *st;
  void *s_local;
  mpc_val_t *x_local;
  
  for (left = (mpc_parser_t *)x; left->name != (char *)0x0; left = (mpc_parser_t *)&left->data) {
    __ptr = left->name;
    p = mpca_grammar_find_parser(*(char **)__ptr,(mpca_grammar_st_t *)s);
    if ((*(uint *)((long)s + 0x18) & 1) != 0) {
      pmVar1 = mpc_predictive(*(mpc_parser_t **)(__ptr + 0x10));
      *(mpc_parser_t **)(__ptr + 0x10) = pmVar1;
    }
    if (*(long *)(__ptr + 8) != 0) {
      pmVar1 = mpc_expect(*(mpc_parser_t **)(__ptr + 0x10),*(char **)(__ptr + 8));
      *(mpc_parser_t **)(__ptr + 0x10) = pmVar1;
    }
    mpc_optimise(*(mpc_parser_t **)(__ptr + 0x10));
    mpc_define(p,*(mpc_parser_t **)(__ptr + 0x10));
    free(*(void **)__ptr);
    free(*(void **)(__ptr + 8));
    free(__ptr);
  }
  free(x);
  return (mpc_val_t *)0x0;
}

Assistant:

static mpc_val_t *mpca_stmt_list_apply_to(mpc_val_t *x, void *s) {

  mpca_grammar_st_t *st = s;
  mpca_stmt_t *stmt;
  mpca_stmt_t **stmts = x;
  mpc_parser_t *left;

  while(*stmts) {
    stmt = *stmts;
    left = mpca_grammar_find_parser(stmt->ident, st);
    if (st->flags & MPCA_LANG_PREDICTIVE) { stmt->grammar = mpc_predictive(stmt->grammar); }
    if (stmt->name) { stmt->grammar = mpc_expect(stmt->grammar, stmt->name); }
    mpc_optimise(stmt->grammar);
    mpc_define(left, stmt->grammar);
    free(stmt->ident);
    free(stmt->name);
    free(stmt);
    stmts++;
  }

  free(x);

  return NULL;
}